

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TextEx(char *text,char *text_end,ImGuiTextFlags flags)

{
  ImVec2 pos_00;
  bool bVar1;
  size_t sVar2;
  uint in_EDX;
  ImVec2 *in_RSI;
  ImVec2 *in_RDI;
  float fVar3;
  ImVec2 IVar4;
  ImRect bb_1;
  ImVec2 text_size_1;
  float wrap_width;
  ImRect bb;
  char *line_end_2;
  int lines_skipped_1;
  char *line_end_1;
  ImRect line_rect;
  char *line_end;
  int lines_skipped;
  int lines_skippable;
  ImVec2 pos;
  ImVec2 text_size;
  float line_height;
  char *line;
  bool wrap_enabled;
  float wrap_pos_x;
  ImVec2 text_pos;
  char *text_begin;
  ImGuiContext *g;
  ImGuiWindow *window;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  undefined8 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  float in_stack_fffffffffffffecc;
  float in_stack_fffffffffffffed8;
  float in_stack_fffffffffffffedc;
  ImVec2 *in_stack_fffffffffffffee0;
  ImRect *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  float fVar5;
  float in_stack_fffffffffffffefc;
  float in_stack_ffffffffffffff00;
  float in_stack_ffffffffffffff04;
  float in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  float in_stack_ffffffffffffff10;
  float in_stack_ffffffffffffff14;
  ImVec2 local_e8;
  ImRect local_e0;
  ImVec2 local_d0;
  ImVec2 local_c8;
  ImVec2 *local_c0;
  int local_b4;
  ImVec2 local_b0;
  ImVec2 local_a8;
  ImVec2 *local_a0;
  ImVec2 local_98;
  ImVec2 local_90;
  ImRect local_88;
  ImVec2 local_78;
  ImVec2 *local_70;
  int local_64;
  int local_60;
  ImVec2 local_5c;
  ImVec2 local_54;
  float local_4c;
  ImVec2 *local_48;
  undefined1 local_3d;
  float local_3c;
  ImVec2 local_38;
  ImVec2 *local_30;
  ImGuiContext *local_28;
  ImGuiWindow *local_20;
  uint local_14;
  ImVec2 *local_10;
  ImVec2 *local_8;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_20 = GetCurrentWindow();
  if ((local_20->SkipItems & 1U) == 0) {
    local_28 = GImGui;
    if (local_8 == (ImVec2 *)0x0) {
      __assert_fail("text != __null",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_widgets.cpp"
                    ,0x92,"void ImGui::TextEx(const char *, const char *, ImGuiTextFlags)");
    }
    local_30 = local_8;
    if (local_10 == (ImVec2 *)0x0) {
      in_stack_fffffffffffffee0 = local_8;
      sVar2 = strlen((char *)local_8);
      local_10 = (ImVec2 *)((long)&in_stack_fffffffffffffee0->x + sVar2);
    }
    ImVec2::ImVec2(&local_38,(local_20->DC).CursorPos.x,
                   (local_20->DC).CursorPos.y + (local_20->DC).CurrLineTextBaseOffset);
    local_3c = (local_20->DC).TextWrapPos;
    local_3d = 0.0 <= local_3c;
    if (((long)local_10 - (long)local_8 < 0x7d1) || ((bool)local_3d)) {
      if ((bool)local_3d) {
        fVar3 = CalcWrapWidthForPos((ImVec2 *)
                                    CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                                    (float)((ulong)in_stack_fffffffffffffec0 >> 0x20));
      }
      else {
        fVar3 = 0.0;
      }
      CalcTextSize((char *)in_stack_fffffffffffffee8,(char *)in_stack_fffffffffffffee0,
                   SUB41((uint)in_stack_fffffffffffffedc >> 0x18,0),in_stack_fffffffffffffed8);
      IVar4 = operator+((ImVec2 *)CONCAT44(fVar3,in_stack_fffffffffffffeb8),(ImVec2 *)0x218630);
      fVar3 = IVar4.x;
      fVar5 = IVar4.y;
      ImRect::ImRect((ImRect *)&stack0xfffffffffffffefc,&local_38,(ImVec2 *)&stack0xfffffffffffffef4
                    );
      ItemSize(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
      bVar1 = ItemAdd(in_stack_fffffffffffffee8,(ImGuiID)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                      (ImRect *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      if (bVar1) {
        IVar4.y = in_stack_ffffffffffffff04;
        IVar4.x = in_stack_ffffffffffffff00;
        RenderTextWrapped(IVar4,(char *)CONCAT44(in_stack_fffffffffffffefc,fVar5),
                          (char *)CONCAT44(fVar3,in_stack_fffffffffffffef0),
                          in_stack_ffffffffffffff00);
      }
    }
    else {
      local_48 = local_8;
      local_4c = GetTextLineHeight();
      ImVec2::ImVec2(&local_54,0.0,0.0);
      local_5c.y = local_38.y;
      local_5c.x = local_38.x;
      if (((local_28->LogEnabled & 1U) == 0) &&
         (local_60 = (int)(((local_20->ClipRect).Min.y - local_38.y) / local_4c), 0 < local_60)) {
        local_64 = 0;
        while( true ) {
          fVar3 = (float)((uint)in_stack_fffffffffffffedc & 0xffffff);
          if (local_48 < local_10) {
            fVar3 = (float)CONCAT13(local_64 < local_60,SUB43(in_stack_fffffffffffffedc,0));
          }
          in_stack_fffffffffffffedc = fVar3;
          if ((char)((uint)in_stack_fffffffffffffedc >> 0x18) == '\0') break;
          local_70 = (ImVec2 *)memchr(local_48,10,(long)local_10 - (long)local_48);
          if (local_70 == (ImVec2 *)0x0) {
            local_70 = local_10;
          }
          if ((local_14 & 1) == 0) {
            in_stack_fffffffffffffed8 = local_54.x;
            local_78 = CalcTextSize((char *)in_stack_fffffffffffffee8,
                                    (char *)in_stack_fffffffffffffee0,
                                    SUB41((uint)in_stack_fffffffffffffedc >> 0x18,0),local_54.x);
            local_54.x = ImMax<float>(in_stack_fffffffffffffed8,local_78.x);
          }
          local_48 = (ImVec2 *)((long)&local_70->x + 1);
          local_64 = local_64 + 1;
        }
        local_5c.y = (float)local_64 * local_4c + local_5c.y;
      }
      if (local_48 < local_10) {
        ImVec2::ImVec2(&local_98,3.4028235e+38,local_4c);
        local_90 = operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)
                             ,(ImVec2 *)0x21827c);
        ImRect::ImRect(&local_88,&local_5c,&local_90);
        while ((local_48 < local_10 &&
               (bVar1 = IsClippedEx((ImRect *)
                                    CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                                    (ImGuiID)((ulong)in_stack_fffffffffffffec0 >> 0x20),
                                    SUB81((ulong)in_stack_fffffffffffffec0 >> 0x18,0)), !bVar1))) {
          local_a0 = (ImVec2 *)memchr(local_48,10,(long)local_10 - (long)local_48);
          if (local_a0 == (ImVec2 *)0x0) {
            local_a0 = local_10;
          }
          in_stack_fffffffffffffecc = local_54.x;
          local_a8 = CalcTextSize((char *)in_stack_fffffffffffffee8,
                                  (char *)in_stack_fffffffffffffee0,
                                  SUB41((uint)in_stack_fffffffffffffedc >> 0x18,0),
                                  in_stack_fffffffffffffed8);
          local_54.x = ImMax<float>(in_stack_fffffffffffffecc,local_a8.x);
          local_b0 = local_5c;
          pos_00.y = in_stack_ffffffffffffff14;
          pos_00.x = in_stack_ffffffffffffff10;
          RenderText(pos_00,(char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                     (char *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                     SUB41((uint)in_stack_fffffffffffffefc >> 0x18,0));
          local_48 = (ImVec2 *)((long)&local_a0->x + 1);
          local_88.Min.y = local_4c + local_88.Min.y;
          local_88.Max.y = local_4c + local_88.Max.y;
          local_5c.y = local_4c + local_5c.y;
        }
        local_b4 = 0;
        while (local_48 < local_10) {
          local_c0 = (ImVec2 *)memchr(local_48,10,(long)local_10 - (long)local_48);
          if (local_c0 == (ImVec2 *)0x0) {
            local_c0 = local_10;
          }
          if ((local_14 & 1) == 0) {
            fVar3 = local_54.x;
            local_c8 = CalcTextSize((char *)in_stack_fffffffffffffee8,
                                    (char *)in_stack_fffffffffffffee0,
                                    SUB41((uint)in_stack_fffffffffffffedc >> 0x18,0),
                                    in_stack_fffffffffffffed8);
            local_54.x = ImMax<float>(fVar3,local_c8.x);
          }
          local_b4 = local_b4 + 1;
          local_48 = (ImVec2 *)((long)&local_c0->x + 1);
        }
        local_5c.y = (float)local_b4 * local_4c + local_5c.y;
      }
      local_d0 = ::operator-((ImVec2 *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)
                             ,(ImVec2 *)0x21854c);
      local_54.y = local_d0.y;
      local_e8 = operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                           (ImVec2 *)0x218573);
      ImRect::ImRect(&local_e0,&local_38,&local_e8);
      ItemSize(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
      ItemAdd(in_stack_fffffffffffffee8,(ImGuiID)((ulong)in_stack_fffffffffffffee0 >> 0x20),
              (ImRect *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    }
  }
  return;
}

Assistant:

void ImGui::TextEx(const char* text, const char* text_end, ImGuiTextFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;

    ImGuiContext& g = *GImGui;
    IM_ASSERT(text != NULL);
    const char* text_begin = text;
    if (text_end == NULL)
        text_end = text + strlen(text); // FIXME-OPT

    const ImVec2 text_pos(window->DC.CursorPos.x, window->DC.CursorPos.y + window->DC.CurrLineTextBaseOffset);
    const float wrap_pos_x = window->DC.TextWrapPos;
    const bool wrap_enabled = (wrap_pos_x >= 0.0f);
    if (text_end - text > 2000 && !wrap_enabled)
    {
        // Long text!
        // Perform manual coarse clipping to optimize for long multi-line text
        // - From this point we will only compute the width of lines that are visible. Optimization only available when word-wrapping is disabled.
        // - We also don't vertically center the text within the line full height, which is unlikely to matter because we are likely the biggest and only item on the line.
        // - We use memchr(), pay attention that well optimized versions of those str/mem functions are much faster than a casually written loop.
        const char* line = text;
        const float line_height = GetTextLineHeight();
        ImVec2 text_size(0,0);

        // Lines to skip (can't skip when logging text)
        ImVec2 pos = text_pos;
        if (!g.LogEnabled)
        {
            int lines_skippable = (int)((window->ClipRect.Min.y - text_pos.y) / line_height);
            if (lines_skippable > 0)
            {
                int lines_skipped = 0;
                while (line < text_end && lines_skipped < lines_skippable)
                {
                    const char* line_end = (const char*)memchr(line, '\n', text_end - line);
                    if (!line_end)
                        line_end = text_end;
                    if ((flags & ImGuiTextFlags_NoWidthForLargeClippedText) == 0)
                        text_size.x = ImMax(text_size.x, CalcTextSize(line, line_end).x);
                    line = line_end + 1;
                    lines_skipped++;
                }
                pos.y += lines_skipped * line_height;
            }
        }

        // Lines to render
        if (line < text_end)
        {
            ImRect line_rect(pos, pos + ImVec2(FLT_MAX, line_height));
            while (line < text_end)
            {
                if (IsClippedEx(line_rect, 0, false))
                    break;

                const char* line_end = (const char*)memchr(line, '\n', text_end - line);
                if (!line_end)
                    line_end = text_end;
                text_size.x = ImMax(text_size.x, CalcTextSize(line, line_end).x);
                RenderText(pos, line, line_end, false);
                line = line_end + 1;
                line_rect.Min.y += line_height;
                line_rect.Max.y += line_height;
                pos.y += line_height;
            }

            // Count remaining lines
            int lines_skipped = 0;
            while (line < text_end)
            {
                const char* line_end = (const char*)memchr(line, '\n', text_end - line);
                if (!line_end)
                    line_end = text_end;
                if ((flags & ImGuiTextFlags_NoWidthForLargeClippedText) == 0)
                    text_size.x = ImMax(text_size.x, CalcTextSize(line, line_end).x);
                line = line_end + 1;
                lines_skipped++;
            }
            pos.y += lines_skipped * line_height;
        }
        text_size.y = (pos - text_pos).y;

        ImRect bb(text_pos, text_pos + text_size);
        ItemSize(text_size, 0.0f);
        ItemAdd(bb, 0);
    }
    else
    {
        const float wrap_width = wrap_enabled ? CalcWrapWidthForPos(window->DC.CursorPos, wrap_pos_x) : 0.0f;
        const ImVec2 text_size = CalcTextSize(text_begin, text_end, false, wrap_width);

        ImRect bb(text_pos, text_pos + text_size);
        ItemSize(text_size, 0.0f);
        if (!ItemAdd(bb, 0))
            return;

        // Render (we don't hide text after ## in this end-user function)
        RenderTextWrapped(bb.Min, text_begin, text_end, wrap_width);
    }
}